

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int xferCompatibleIndex(Index *pDest,Index *pSrc)

{
  byte bVar1;
  char *pcVar2;
  int iVar3;
  long lVar4;
  ulong uVar5;
  uint uVar6;
  
  uVar6 = 0;
  if (((pDest->nKeyCol == pSrc->nKeyCol) && (pDest->nColumn == pSrc->nColumn)) &&
     (pDest->onError == pSrc->onError)) {
    if (pDest->nKeyCol != 0) {
      uVar5 = 0;
      do {
        if (pSrc->aiColumn[uVar5] != pDest->aiColumn[uVar5]) {
          return 0;
        }
        if ((pSrc->aiColumn[uVar5] == -2) &&
           (iVar3 = sqlite3ExprCompare((Parse *)0x0,pSrc->aColExpr->a[uVar5].pExpr,
                                       pDest->aColExpr->a[uVar5].pExpr,-1), iVar3 != 0)) {
          return 0;
        }
        if (pSrc->aSortOrder[uVar5] != pDest->aSortOrder[uVar5]) {
          return 0;
        }
        pcVar2 = pDest->azColl[uVar5];
        if (pSrc->azColl[uVar5] != (char *)0x0) {
          if (pcVar2 == (char *)0x0) {
            return 0;
          }
          lVar4 = 0;
          do {
            bVar1 = pSrc->azColl[uVar5][lVar4];
            if (bVar1 == pcVar2[lVar4]) {
              if ((ulong)bVar1 == 0) goto LAB_00194e2d;
            }
            else if (""[bVar1] != ""[(byte)pcVar2[lVar4]]) {
              return 0;
            }
            lVar4 = lVar4 + 1;
          } while( true );
        }
        if (pcVar2 != (char *)0x0) {
          return 0;
        }
LAB_00194e2d:
        uVar5 = uVar5 + 1;
      } while (uVar5 < pSrc->nKeyCol);
    }
    iVar3 = sqlite3ExprCompare((Parse *)0x0,pSrc->pPartIdxWhere,pDest->pPartIdxWhere,-1);
    uVar6 = (uint)(iVar3 == 0);
  }
  return uVar6;
}

Assistant:

static int xferCompatibleIndex(Index *pDest, Index *pSrc){
  int i;
  assert( pDest && pSrc );
  assert( pDest->pTable!=pSrc->pTable );
  if( pDest->nKeyCol!=pSrc->nKeyCol || pDest->nColumn!=pSrc->nColumn ){
    return 0;   /* Different number of columns */
  }
  if( pDest->onError!=pSrc->onError ){
    return 0;   /* Different conflict resolution strategies */
  }
  for(i=0; i<pSrc->nKeyCol; i++){
    if( pSrc->aiColumn[i]!=pDest->aiColumn[i] ){
      return 0;   /* Different columns indexed */
    }
    if( pSrc->aiColumn[i]==XN_EXPR ){
      assert( pSrc->aColExpr!=0 && pDest->aColExpr!=0 );
      if( sqlite3ExprCompare(0, pSrc->aColExpr->a[i].pExpr,
                             pDest->aColExpr->a[i].pExpr, -1)!=0 ){
        return 0;   /* Different expressions in the index */
      }
    }
    if( pSrc->aSortOrder[i]!=pDest->aSortOrder[i] ){
      return 0;   /* Different sort orders */
    }
    if( sqlite3_stricmp(pSrc->azColl[i],pDest->azColl[i])!=0 ){
      return 0;   /* Different collating sequences */
    }
  }
  if( sqlite3ExprCompare(0, pSrc->pPartIdxWhere, pDest->pPartIdxWhere, -1) ){
    return 0;     /* Different WHERE clauses */
  }

  /* If no test above fails then the indices must be compatible */
  return 1;
}